

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontMatrix.h
# Opt level: O2

void __thiscall
TPZFrontMatrix<std::complex<double>,_TPZStackEqnStorage<std::complex<double>_>,_TPZFrontSym<std::complex<double>_>_>
::CopyFrom(TPZFrontMatrix<std::complex<double>,_TPZStackEqnStorage<std::complex<double>_>,_TPZFrontSym<std::complex<double>_>_>
           *this,TPZMatrix<std::complex<double>_> *mat)

{
  TPZFrontMatrix<std::complex<double>,_TPZStackEqnStorage<std::complex<double>_>,_TPZFrontSym<std::complex<double>_>_>
  *pTVar1;
  
  if (mat != (TPZMatrix<std::complex<double>_> *)0x0) {
    pTVar1 = (TPZFrontMatrix<std::complex<double>,_TPZStackEqnStorage<std::complex<double>_>,_TPZFrontSym<std::complex<double>_>_>
              *)__dynamic_cast(mat,&TPZMatrix<std::complex<double>>::typeinfo,
                               &TPZFrontMatrix<std::complex<double>,TPZStackEqnStorage<std::complex<double>>,TPZFrontSym<std::complex<double>>>
                                ::typeinfo,0);
    if (pTVar1 != (TPZFrontMatrix<std::complex<double>,_TPZStackEqnStorage<std::complex<double>_>,_TPZFrontSym<std::complex<double>_>_>
                   *)0x0) {
      operator=(this,pTVar1);
      return;
    }
  }
  std::operator<<((ostream *)&std::cerr,
                  "virtual void TPZFrontMatrix<std::complex<double>, TPZStackEqnStorage<std::complex<double>>, TPZFrontSym<std::complex<double>>>::CopyFrom(const TPZMatrix<TVar> *) [TVar = std::complex<double>, store = TPZStackEqnStorage<std::complex<double>>, front = TPZFrontSym<std::complex<double>>]"
                 );
  std::operator<<((ostream *)&std::cerr,"\nERROR: Called with incompatible type\n.");
  std::operator<<((ostream *)&std::cerr,"Aborting...\n");
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Frontal/TPZFrontMatrix.h"
             ,0xb6);
}

Assistant:

void CopyFrom(const TPZMatrix<TVar> *  mat) override        
  {                                                           
    auto *from = dynamic_cast<const TPZFrontMatrix<TVar,store,front> *>(mat);                
    if (from) {                                               
      *this = *from;                                          
    }                                                         
    else                                                      
      {                                                       
        PZError<<__PRETTY_FUNCTION__;                         
        PZError<<"\nERROR: Called with incompatible type\n."; 
        PZError<<"Aborting...\n";                             
        DebugStop();                                          
      }                                                       
  }